

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O0

void __thiscall DSFrame::DSFrame(DSFrame *this)

{
  DSFrame *this_local;
  
  this->FrameWidth = 0;
  this->FrameHeight = 0;
  this->SrcPointers = (uchar **)0x0;
  this->StrideBytes = (int *)0x0;
  this->DstPointers = (uchar **)0x0;
  DSFormat::DSFormat(&this->Format);
  this->_vssrc = (VSFrameRef *)0x0;
  this->_vsdst = (VSFrameRef *)0x0;
  this->_vscore = (VSCore *)0x0;
  this->_vsapi = (VSAPI *)0x0;
  this->_vsformat = (VSFormat *)0x0;
  PVideoFrame::PVideoFrame(&this->_avssrc);
  this->_env = (IScriptEnvironment *)0x0;
  this->planes_y[0] = 1;
  this->planes_y[1] = 2;
  this->planes_y[2] = 4;
  this->planes_y[3] = 0x10;
  this->planes_r[0] = 0x20;
  this->planes_r[1] = 0x40;
  this->planes_r[2] = 0x80;
  this->planes_r[3] = 0x10;
  this->planes = (int *)0x0;
  return;
}

Assistant:

DSFrame() {}